

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat.h
# Opt level: O3

int __thiscall
wasm::Flat::anon_func::VerifyFlatness::verify
          (VerifyFlatness *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  Function *pFVar1;
  int in_EAX;
  Fatal *this_00;
  Name name;
  undefined1 local_1b8 [392];
  uchar *local_30;
  char *message_local;
  
  if ((int)ctx != 0) {
    return in_EAX;
  }
  local_30 = sig;
  Fatal::Fatal((Fatal *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),"IR must be flat: run --flatten beforehand (",0x2b);
  this_00 = Fatal::operator<<((Fatal *)local_1b8,(char **)&local_30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this_00->field_0x10,", in ",5);
  pFVar1 = (this->
           super_PostWalker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>).
           super_Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>.
           currFunction;
  name.super_IString.str._M_str = (char *)siglen;
  name.super_IString.str._M_len =
       (size_t)(pFVar1->super_Importable).super_Named.name.super_IString.str._M_str;
  wasm::operator<<((wasm *)&this_00->field_0x10,
                   (ostream *)(pFVar1->super_Importable).super_Named.name.super_IString.str._M_len,
                   name);
  message_local._7_1_ = 0x29;
  Fatal::operator<<(this_00,(char *)((long)&message_local + 7));
  Fatal::~Fatal((Fatal *)local_1b8);
}

Assistant:

void verify(bool condition, const char* message) {
      if (!condition) {
        Fatal() << "IR must be flat: run --flatten beforehand (" << message
                << ", in " << getFunction()->name << ')';
      }
    }